

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O3

void __thiscall
OmegaSN::OmegaSN(OmegaSN *this,vector<double,_std::allocator<double>_> *values,double firstdata,
                uint nbSeg,uint n)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  double *pdVar4;
  double **ppdVar5;
  double ***pppdVar6;
  uint ***pppuVar7;
  uint **ppuVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint i;
  long lVar14;
  ulong uVar15;
  
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  uVar11 = uVar3 & 0x7fffffff8;
  uVar3 = uVar3 >> 3;
  uVar2 = (uint)uVar3;
  this->nbStates = uVar2;
  this->nbSegments = nbSeg;
  pdVar4 = (double *)operator_new__(uVar11);
  this->states = pdVar4;
  if (uVar2 != 0) {
    uVar10 = 0;
    do {
      pdVar4[uVar10] = pdVar1[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uVar3 & 0xffffffff) != uVar10);
  }
  ppdVar5 = (double **)operator_new__(0x18);
  this->S12P = ppdVar5;
  uVar10 = (ulong)(n + 1) * 8;
  lVar14 = 0;
  do {
    pdVar4 = (double *)operator_new__(uVar10);
    this->S12P[lVar14] = pdVar4;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  uVar12 = (ulong)nbSeg * 8;
  pppdVar6 = (double ***)operator_new__(uVar12);
  this->Q = pppdVar6;
  pppuVar7 = (uint ***)operator_new__(uVar12);
  this->lastChpt = pppuVar7;
  pppuVar7 = (uint ***)operator_new__(uVar12);
  this->lastIndState = pppuVar7;
  if (nbSeg != 0) {
    uVar13 = (ulong)(n + 1) << 2;
    uVar12 = 0;
    do {
      ppdVar5 = (double **)operator_new__(uVar11);
      this->Q[uVar12] = ppdVar5;
      ppuVar8 = (uint **)operator_new__(uVar11);
      this->lastChpt[uVar12] = ppuVar8;
      ppuVar8 = (uint **)operator_new__(uVar11);
      this->lastIndState[uVar12] = ppuVar8;
      if (uVar2 != 0) {
        uVar15 = 0;
        do {
          pdVar4 = (double *)operator_new__(uVar10);
          this->Q[uVar12][uVar15] = pdVar4;
          puVar9 = (uint *)operator_new__(uVar13);
          this->lastChpt[uVar12][uVar15] = puVar9;
          puVar9 = (uint *)operator_new__(uVar13);
          this->lastIndState[uVar12][uVar15] = puVar9;
          uVar15 = uVar15 + 1;
        } while ((uVar3 & 0xffffffff) != uVar15);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != nbSeg);
  }
  return;
}

Assistant:

OmegaSN::OmegaSN(std::vector< double >& values, double firstdata, unsigned int nbSeg, unsigned int n)
{
  nbStates = values.size();
  nbSegments = nbSeg;
  states = new double[nbStates];
  for(unsigned int i = 0; i < nbStates; i++){states[i] = values[i];}

  ///
  /// MATRIX INITIALIZATION
  ///
  S12P = new double*[3]; ///matrix of vectors S1, S2 and SP
  for(unsigned int i = 0; i < 3; i++){S12P[i] = new double[n + 1];}

  Q = new double**[nbSegments];
  lastChpt = new unsigned int**[nbSegments];
  lastIndState = new unsigned int**[nbSegments];

  for(unsigned int i = 0; i < nbSegments; i++)
  {
    Q[i] = new double*[nbStates];
    lastChpt[i] = new unsigned int*[nbStates];
    lastIndState[i] = new unsigned int*[nbStates];
    for(unsigned int j = 0; j < nbStates; j++)
    {
      Q[i][j] = new double[n + 1];
      lastChpt[i][j] = new unsigned int[n + 1];
      lastIndState[i][j] = new unsigned int[n + 1];
    }
  }
}